

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
CharacterInstance::op_isAlphanumeric
          (string *__return_storage_ptr__,CharacterInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  allocator local_9;
  
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = str_utils::is_alphanumeric(this->_value);
    pcVar3 = "false";
    if (bVar1) {
      pcVar3 = "true";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_9);
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_last(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return "\"" + str_utils::escape(_value.substr(int(_value.size()) - n), '"') + "\"";
}